

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt.c
# Opt level: O0

LispPTR N_OP_blt(LispPTR destptr,LispPTR sourceptr,LispPTR wordcount)

{
  DLword *pDVar1;
  uint local_2c;
  DLword *pDStack_28;
  int nw;
  DLword *dest68k;
  DLword *source68k;
  LispPTR wordcount_local;
  LispPTR sourceptr_local;
  LispPTR destptr_local;
  
  if ((wordcount & 0xfff0000) == 0xe0000) {
    local_2c = wordcount & 0xffff;
    pDVar1 = NativeAligned2FromLAddr(sourceptr);
    dest68k = pDVar1 + (int)local_2c;
    pDStack_28 = NativeAligned2FromLAddr(destptr);
    pDStack_28 = pDStack_28 + (int)local_2c;
    for (; sourceptr_local = wordcount, local_2c != 0; local_2c = local_2c - 1) {
      dest68k = dest68k + -1;
      pDStack_28 = pDStack_28 + -1;
      *(undefined2 *)((ulong)pDStack_28 ^ 2) = *(undefined2 *)((ulong)dest68k ^ 2);
    }
  }
  else {
    MachineState.errorexit = 1;
    sourceptr_local = 0xffffffff;
    MachineState.tosvalue = wordcount;
  }
  return sourceptr_local;
}

Assistant:

LispPTR N_OP_blt(LispPTR destptr, LispPTR sourceptr, LispPTR wordcount) {
  DLword *source68k;
  DLword *dest68k;
  int nw;

  if ((wordcount & SEGMASK) != S_POSITIVE) ERROR_EXIT(wordcount);
  nw = wordcount & 0xffff;

  source68k = NativeAligned2FromLAddr(sourceptr) + nw;
  dest68k = NativeAligned2FromLAddr(destptr) + nw;

  while (nw) {
    (GETWORD(--dest68k)) = GETWORD(--source68k);
    nw--;
  }

  return (wordcount);
}